

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::SubRoutineLocArraysMix::Run(SubRoutineLocArraysMix *this)

{
  UniformValueGenerator *generator;
  pointer pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  value_type_conflict1 *__val;
  long lVar4;
  long lVar5;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  vector<int,_std::allocator<int>_> arraySizesSegmented;
  vector<int,_std::allocator<int>_> local_3a8;
  undefined1 local_390 [280];
  string local_278 [32];
  int local_258;
  int local_254;
  GLenum GStack_250;
  bool local_24c;
  bool bStack_24b;
  _Alloc_hider local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined1 local_228 [96];
  _Alloc_hider _Stack_1c8;
  int local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  pair<int,_int> local_1a8;
  string local_1a0 [32];
  string local_180 [32];
  int local_160;
  int local_15c;
  GLenum GStack_158;
  bool local_154;
  bool bStack_153;
  SubroutineFunctionSet functions_st0;
  SubroutineFunctionSet functions_st1;
  UniformType local_d8;
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  local_48;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,2);
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st1,generator,2);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubroutineUniform::SubroutineUniform
            ((SubroutineUniform *)local_390,generator,&functions_st0,(Loc)ZEXT812(1),2,
             (DefOccurence)0x0,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != &local_238) {
    operator_delete(local_248._M_p,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_390 + 0x70));
  if ((pointer)local_390._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_390._80_8_,local_390._96_8_ - local_390._80_8_);
  }
  pcVar1 = local_390 + 0x28;
  if ((pointer)local_390._24_8_ != pcVar1) {
    operator_delete((void *)local_390._24_8_,local_390._40_8_ + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_390);
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(8);
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 0;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 2;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 3;
  arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::vector<int,_std::allocator<int>_>::vector(&local_3a8,&arraySizesSegmented);
  SubroutineFunctionSet::SubroutineFunctionSet((SubroutineFunctionSet *)local_390,&functions_st0);
  local_390._56_4_ = 3;
  local_390._60_4_ = Dec;
  local_390._64_4_ = ALL_SH;
  local_390._72_4_ = ALL_SH;
  local_390[0x4c] = true;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)(local_390 + 0x50),&local_3a8);
  local_390[0x68] = true;
  UniformType::UniformType((UniformType *)local_228,0x1405,0);
  UniformValue::UniformValue((UniformValue *)(local_390 + 0x70),(UniformType *)local_228,generator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_1c8._M_p != &local_1b8) {
    operator_delete(_Stack_1c8._M_p,(ulong)(local_1b8._M_allocated_capacity + 1));
  }
  if ((undefined1 *)local_228._64_8_ != local_228 + 0x50) {
    operator_delete((void *)local_228._64_8_,local_228._80_8_ + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector((vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
             *)(local_228 + 0x28));
  if ((pointer)local_228._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._8_8_,local_228._24_8_ - local_228._8_8_);
  }
  local_240 = 0;
  local_238._M_local_buf[0] = '\0';
  local_390._68_4_ = 1;
  local_248._M_p = (pointer)&local_238;
  if (local_390._88_8_ - local_390._80_8_ != 0) {
    lVar4 = (long)(local_390._88_8_ - local_390._80_8_) >> 2;
    lVar5 = 0;
    do {
      if (*(int *)(local_390._80_8_ + lVar5 * 4) < 1) {
        __assert_fail("arraySizesSegmented[i] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x34e,
                      "glcts::(anonymous namespace)::SubroutineUniform::SubroutineUniform(UniformValueGenerator &, SubroutineFunctionSet &, Loc, std::vector<int>, DefOccurence, bool)"
                     );
      }
      local_390._68_4_ = local_390._68_4_ * *(int *)(local_390._80_8_ + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  UniformType::UniformType(&local_d8,0x1405,local_390._68_4_);
  UniformValue::UniformValue((UniformValue *)local_228,&local_d8,generator);
  uVar3 = local_390._128_8_;
  uVar2 = local_390._112_8_;
  local_390._112_8_ = local_228._0_8_;
  local_390._120_8_ = local_228._8_8_;
  local_390._128_8_ = local_228._16_8_;
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2,uVar3 - uVar2);
  }
  uVar3 = local_390._152_8_;
  uVar2 = local_390._136_8_;
  local_390._136_8_ = local_228._24_8_;
  local_390._144_8_ = local_228._32_8_;
  local_390._152_8_ = local_228._40_8_;
  local_228._24_8_ = (pointer)0x0;
  local_228._32_8_ = (pointer)0x0;
  local_228._40_8_ = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2,uVar3 - uVar2);
  }
  uVar3 = local_390._176_8_;
  uVar2 = local_390._160_8_;
  local_390._160_8_ = local_228._48_8_;
  local_390._168_8_ = local_228._56_8_;
  local_390._176_8_ = local_228._64_8_;
  local_228._48_8_ = (pointer)0x0;
  local_228._56_8_ = (pointer)0x0;
  local_228._64_8_ = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2,uVar3 - uVar2);
  }
  uVar3 = local_390._208_8_;
  uVar2 = local_390._192_8_;
  local_390._184_4_ = local_228._72_4_;
  local_390._192_8_ = local_228._80_8_;
  local_390._200_8_ = local_228._88_8_;
  local_390._208_8_ = _Stack_1c8._M_p;
  local_228._80_8_ = 0;
  local_228._88_8_ = 0;
  _Stack_1c8._M_p = (pointer)0x0;
  if ((pointer)uVar2 != (pointer)0x0) {
    operator_delete((void *)uVar2,uVar3 - uVar2);
  }
  local_48.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_390._240_8_;
  local_48.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_390._232_8_;
  local_48.
  super__Vector_base<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_390._224_8_;
  local_390._216_4_ = local_1c0;
  local_390._224_8_ = local_1b8._M_allocated_capacity;
  local_390._232_8_ = local_1b8._8_8_;
  local_390._240_4_ = local_1a8.first;
  local_390._244_4_ = local_1a8.second;
  local_1b8._M_allocated_capacity = 0;
  local_1b8._8_8_ = 0;
  local_1a8.first = 0;
  local_1a8.second = 0;
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_48);
  std::__cxx11::string::operator=((string *)(local_390 + 0xf8),local_1a0);
  std::__cxx11::string::operator=(local_278,local_180);
  local_258 = local_160;
  local_254 = local_15c;
  GStack_250 = GStack_158;
  local_24c = local_154;
  bStack_24b = bStack_153;
  UniformValue::~UniformValue((UniformValue *)local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.refStrType._M_dataplus._M_p != &local_d8.refStrType.field_2) {
    operator_delete(local_d8.refStrType._M_dataplus._M_p,
                    local_d8.refStrType.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.strType._M_dataplus._M_p != &local_d8.strType.field_2) {
    operator_delete(local_d8.strType._M_dataplus._M_p,
                    local_d8.strType.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
  ::~vector(&local_d8.childTypes);
  if (local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (0 < (int)local_390._68_4_) {
    lVar4 = 0;
    do {
      ((GLenum *)local_390._160_8_)[lVar4] =
           (GLenum)((ulong)(long)(int)((GLenum *)local_390._160_8_)[lVar4] %
                   (ulong)(((long)(local_390._8_8_ - local_390._0_8_) >> 3) * 0xf83e0f83e0f83e1));
      lVar4 = lVar4 + 1;
    } while (lVar4 < (int)local_390._68_4_);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != &local_238) {
    operator_delete(local_248._M_p,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_390 + 0x70));
  if ((pointer)local_390._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_390._80_8_,local_390._96_8_ - local_390._80_8_);
  }
  if ((pointer)local_390._24_8_ != pcVar1) {
    operator_delete((void *)local_390._24_8_,local_390._40_8_ + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_390);
  if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SubroutineUniform::SubroutineUniform
            ((SubroutineUniform *)local_390,generator,&functions_st1,(Loc)ZEXT812(9),0,
             (DefOccurence)0x0,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_390);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_p != &local_238) {
    operator_delete(local_248._M_p,
                    CONCAT71(local_238._M_allocated_capacity._1_7_,local_238._M_local_buf[0]) + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_390 + 0x70));
  if ((pointer)local_390._80_8_ != (pointer)0x0) {
    operator_delete((void *)local_390._80_8_,local_390._96_8_ - local_390._80_8_);
  }
  if ((pointer)local_390._24_8_ != pcVar1) {
    operator_delete((void *)local_390._24_8_,local_390._40_8_ + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_390);
  lVar4 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
  if (arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector(&subroutineUniforms);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)functions_st1.typeName._M_dataplus._M_p != &functions_st1.typeName.field_2) {
    operator_delete(functions_st1.typeName._M_dataplus._M_p,
                    functions_st1.typeName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector(&functions_st1.fn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)functions_st0.typeName._M_dataplus._M_p != &functions_st0.typeName.field_2) {
    operator_delete(functions_st0.typeName._M_dataplus._M_p,
                    functions_st0.typeName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector(&functions_st0.fn);
  return lVar4;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		//subroutine(st0) vec4 sf0(float param) { .... };
		//subroutine(st0) vec4 sf1(float param) { .... };
		SubroutineFunctionSet functions_st0(uniformValueGenerator, 2);

		//subroutine vec4 st1(float param);
		//subroutine(st1) vec4 sf2(float param) { .... };
		//subroutine(st1) vec4 sf3(float param) { .... };
		SubroutineFunctionSet functions_st1(uniformValueGenerator, 2);

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 1) subroutine uniform st0 u0[2];
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(1), 2));

		////layout(location = 3) subroutine uniform st0 u1[2][3];
		std::vector<int> arraySizesSegmented(2);
		arraySizesSegmented[0] = 2;
		arraySizesSegmented[1] = 3;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(3), arraySizesSegmented));

		//layout(location = 9) subroutine uniform st1 u2;
		subroutineUniforms.push_back(SubroutineUniform(uniformValueGenerator, functions_st1, Loc::C(9)));

		return doRun(subroutineUniforms);
	}